

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseVisitor.hpp
# Opt level: O2

void __thiscall OpenMD::BaseVisitor::~BaseVisitor(BaseVisitor *this)

{
  this->_vptr_BaseVisitor = (_func_int **)&PTR__BaseVisitor_00283070;
  std::__cxx11::string::~string((string *)&this->visitorName);
  return;
}

Assistant:

virtual ~BaseVisitor() {}